

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_write_hlp(mbedtls_mpi *X,int radix,char **p)

{
  char *pcVar1;
  int iVar2;
  ulong local_38;
  mbedtls_mpi_uint r;
  char **ppcStack_28;
  int ret;
  char **p_local;
  mbedtls_mpi *pmStack_18;
  int radix_local;
  mbedtls_mpi *X_local;
  
  if ((radix < 2) || (0x10 < radix)) {
    X_local._4_4_ = -4;
  }
  else {
    ppcStack_28 = p;
    p_local._4_4_ = radix;
    pmStack_18 = X;
    r._4_4_ = mbedtls_mpi_mod_int(&local_38,X,(long)radix);
    if (((r._4_4_ == 0) &&
        (r._4_4_ = mbedtls_mpi_div_int(pmStack_18,(mbedtls_mpi *)0x0,pmStack_18,(long)p_local._4_4_)
        , r._4_4_ == 0)) &&
       ((iVar2 = mbedtls_mpi_cmp_int(pmStack_18,0), iVar2 == 0 ||
        (r._4_4_ = mpi_write_hlp(pmStack_18,p_local._4_4_,ppcStack_28), r._4_4_ == 0)))) {
      if (local_38 < 10) {
        pcVar1 = *ppcStack_28;
        *ppcStack_28 = pcVar1 + 1;
        *pcVar1 = (char)local_38 + '0';
      }
      else {
        pcVar1 = *ppcStack_28;
        *ppcStack_28 = pcVar1 + 1;
        *pcVar1 = (char)local_38 + '7';
      }
    }
    X_local._4_4_ = r._4_4_;
  }
  return X_local._4_4_;
}

Assistant:

static int mpi_write_hlp( mbedtls_mpi *X, int radix, char **p )
{
    int ret;
    mbedtls_mpi_uint r;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, radix ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_div_int( X, NULL, X, radix ) );

    if( mbedtls_mpi_cmp_int( X, 0 ) != 0 )
        MBEDTLS_MPI_CHK( mpi_write_hlp( X, radix, p ) );

    if( r < 10 )
        *(*p)++ = (char)( r + 0x30 );
    else
        *(*p)++ = (char)( r + 0x37 );

cleanup:

    return( ret );
}